

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 SyLexTokenizeInput(SyLex *pLex,char *zInput,sxu32 nLen,void *pCtxData,ProcSort xSort,
                        ProcCmp xCmp)

{
  sxu32 *psVar1;
  sxi32 sVar2;
  uchar *puVar3;
  uchar *puVar4;
  SyToken sToken;
  SyToken local_40;
  
  (pLex->sStream).zInput = (uchar *)zInput;
  (pLex->sStream).zText = (uchar *)zInput;
  puVar3 = (uchar *)(zInput + nLen);
  (pLex->sStream).zEnd = puVar3;
  do {
    if (puVar3 <= zInput) {
      return 0;
    }
    sVar2 = (*pLex->xTokenizer)(&pLex->sStream,&local_40,pLex->pUserData,(void *)0x0);
    if (sVar2 == -0x19) {
      psVar1 = &(pLex->sStream).nIgn;
      *psVar1 = *psVar1 + 1;
    }
    else {
      if (sVar2 != 0) {
        if (sVar2 != -10) {
          return 0;
        }
        return -10;
      }
      if ((pLex->pTokenSet != (SySet *)0x0) &&
         (sVar2 = SySetPut(pLex->pTokenSet,&local_40), sVar2 != 0)) {
        return 0;
      }
    }
    puVar4 = (pLex->sStream).zText;
    if (puVar4 <= zInput) {
      puVar4 = (uchar *)zInput + 1;
      (pLex->sStream).zText = puVar4;
    }
    puVar3 = (pLex->sStream).zEnd;
    zInput = (char *)puVar4;
  } while( true );
}

Assistant:

JX9_PRIVATE sxi32 SyLexTokenizeInput(SyLex *pLex, const char *zInput, sxu32 nLen, void *pCtxData, ProcSort xSort, ProcCmp xCmp)
{
	const unsigned char *zCur;
	SyStream *pStream;
	SyToken sToken;
	sxi32 rc;
#if defined (UNTRUST)
	if ( INVALID_LEXER(pLex) || zInput == 0 ){
		return SXERR_CORRUPT;
	}
#endif
	pStream = &pLex->sStream;
	/* Point to the head of the input */
	pStream->zText = pStream->zInput = (const unsigned char *)zInput;
	/* Point to the end of the input */
	pStream->zEnd = &pStream->zInput[nLen];
	for(;;){
		if( pStream->zText >= pStream->zEnd ){
			/* End of the input reached */
			break;
		}
		zCur = pStream->zText;
		/* Call the tokenizer callback */
		rc = pLex->xTokenizer(pStream, &sToken, pLex->pUserData, pCtxData);
		if( rc != SXRET_OK && rc != SXERR_CONTINUE ){
			/* Tokenizer callback request an operation abort */
			if( rc == SXERR_ABORT ){
				return SXERR_ABORT;
			}
			break;
		}
		if( rc == SXERR_CONTINUE ){
			/* Request to ignore this token */
			pStream->nIgn++;
		}else if( pLex->pTokenSet  ){
			/* Put the token in the set */
			rc = SySetPut(pLex->pTokenSet, (const void *)&sToken);
			if( rc != SXRET_OK ){
				break;
			}
		}
		if( zCur >= pStream->zText ){
			/* Automatic advance of the stream cursor */
			pStream->zText = &zCur[1];
		}
	}
	if( xSort &&  pLex->pTokenSet ){
		SyToken *aToken = (SyToken *)SySetBasePtr(pLex->pTokenSet);
		/* Sort the extrated tokens */
		if( xCmp == 0 ){
			/* Use a default comparison function */
			xCmp = SyMemcmp;
		}
		xSort(aToken, SySetUsed(pLex->pTokenSet), sizeof(SyToken), xCmp);
	}
	return SXRET_OK;
}